

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

uint32_t get_error_code_from_lib_error_code(int lib_error_code)

{
  switch(lib_error_code) {
  case -0x215:
    return 7;
  case -0x214:
  case -0x213:
    goto switchD_00168d47_caseD_fffffdec;
  case -0x212:
  case -0x211:
  case -0x210:
  case -0x20f:
  case -0x20e:
  case -0x20d:
    return 2;
  case -0x20c:
    return 3;
  case -0x20b:
    return 9;
  case -0x20a:
    return 6;
  default:
    if (lib_error_code == -0x1fe) {
      return 5;
    }
    if (lib_error_code != -0x1f9) {
      return 2;
    }
switchD_00168d47_caseD_fffffdec:
    return 1;
  }
}

Assistant:

static uint32_t get_error_code_from_lib_error_code(int lib_error_code) {
  switch (lib_error_code) {
  case NGHTTP2_ERR_STREAM_CLOSED:
    return NGHTTP2_STREAM_CLOSED;
  case NGHTTP2_ERR_HEADER_COMP:
    return NGHTTP2_COMPRESSION_ERROR;
  case NGHTTP2_ERR_FRAME_SIZE_ERROR:
    return NGHTTP2_FRAME_SIZE_ERROR;
  case NGHTTP2_ERR_FLOW_CONTROL:
    return NGHTTP2_FLOW_CONTROL_ERROR;
  case NGHTTP2_ERR_REFUSED_STREAM:
    return NGHTTP2_REFUSED_STREAM;
  case NGHTTP2_ERR_PROTO:
  case NGHTTP2_ERR_HTTP_HEADER:
  case NGHTTP2_ERR_HTTP_MESSAGING:
    return NGHTTP2_PROTOCOL_ERROR;
  default:
    return NGHTTP2_INTERNAL_ERROR;
  }
}